

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SkipData(CSzData *sd)

{
  CSzData *in_RDI;
  int __result__;
  UInt64 size;
  ulong local_18;
  CSzData *local_10;
  SRes local_4;
  
  local_10 = in_RDI;
  local_4 = ReadNumber(in_RDI,&local_18);
  if (local_4 == 0) {
    if (local_10->Size < local_18) {
      local_4 = 0x10;
    }
    else {
      local_10->Size = local_10->Size - local_18;
      local_10->Data = local_10->Data + local_18;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static SRes SkipData(CSzData *sd)
{
  UInt64 size;
  RINOK(ReadNumber(sd, &size));
  if (size > sd->Size)
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, size);
  return SZ_OK;
}